

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

DepSet * kratos::DependencyVisitor::get_dep(DepSet *__return_storage_ptr__,Var *var)

{
  __node_base_ptr *this;
  undefined1 local_88 [8];
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  linked_deps;
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  deps;
  Var *var_local;
  
  this = &linked_deps._M_h._M_single_bucket;
  std::
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  ::unordered_set((unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
                   *)this);
  std::
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  ::unordered_map((unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                   *)local_88);
  get_var_deps(var,(unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
                    *)this,
               (unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                *)local_88);
  std::
  pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_>
  ::
  pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>_&,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_&,_true>
            (__return_storage_ptr__,
             (unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
              *)&linked_deps._M_h._M_single_bucket,
             (unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
              *)local_88);
  std::
  unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
  ::~unordered_map((unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                    *)local_88);
  std::
  unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
  ::~unordered_set((unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
                    *)&linked_deps._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

static DepSet get_dep(Var *var) {
        std::unordered_set<const Var *> deps;
        std::unordered_map<const Var *, std::unordered_map<uint32_t, Var *>> linked_deps;
        get_var_deps(var, deps, linked_deps);
        return {deps, linked_deps};
    }